

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell::createTest
          (TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell *this)

{
  Utest *this_00;
  TEST_MockComparatorCopierTest_customObjectParameterSucceeds_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x6a);
  TEST_MockComparatorCopierTest_customObjectParameterSucceeds_Test::
  TEST_MockComparatorCopierTest_customObjectParameterSucceeds_Test
            ((TEST_MockComparatorCopierTest_customObjectParameterSucceeds_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterSucceeds)
{
    MyTypeForTesting object(1);
    MyTypeForTestingComparator comparator;
    mock().installComparator("MyTypeForTesting", comparator);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();

    mock().removeAllComparatorsAndCopiers();
}